

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t bm;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  MIR_insn_t pMVar4;
  out_edge_t peVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  out_edge_t peVar9;
  bb_insn_t pbVar10;
  
  peVar9 = (bb->out_edges).head;
  uVar8 = 0;
LAB_0016acc0:
  if (peVar9 == (out_edge_t)0x0) {
    return uVar8;
  }
  uVar2 = bitmap_ior(bb->out,bb->out,peVar9->dst->in);
  uVar8 = uVar2 | uVar8;
  if (gen_ctx->lr_ctx->ssa_live_info_p != 0) {
    for (pbVar10 = (peVar9->dst->bb_insns).head; pbVar10 != (bb_insn_t)0x0;
        pbVar10 = (pbVar10->bb_insn_link).next) {
      pMVar4 = pbVar10->insn;
      if (*(int *)&pMVar4->field_0x18 != 0xb4) {
        if (*(int *)&pMVar4->field_0x18 == 0xba) {
          peVar5 = (peVar9->dst->in_edges).head;
          if (peVar5 != peVar9 && peVar5 != (out_edge_t)0x0) {
            lVar6 = 1;
            goto LAB_0016ad53;
          }
          lVar6 = 1;
          goto LAB_0016ad64;
        }
        break;
      }
    }
  }
  goto LAB_0016adec;
  while (peVar5 != peVar9) {
LAB_0016ad53:
    peVar5 = (peVar5->in_link).next;
    lVar6 = lVar6 + 1;
    if (peVar5 == (in_edge_t)0x0) break;
  }
LAB_0016ad64:
  if (peVar5 != peVar9) {
LAB_0016ae0c:
    __assert_fail("e2 == e",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1732,"int live_con_func_n(gen_ctx_t, bb_t)");
  }
  do {
    if (pMVar4->ops[lVar6].field_0x8 == '\x02') {
      bm = bb->out;
      iVar3 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,pMVar4->ops[lVar6].u.reg);
      uVar7 = (ulong)iVar3;
      bitmap_expand(bm,uVar7 + 1);
      if (bm == (bitmap_t)0x0) {
        live_con_func_n_cold_1();
        goto LAB_0016ae0c;
      }
      uVar1 = bm->varr[uVar7 >> 6];
      uVar8 = uVar8 | (uVar1 >> (uVar7 & 0x3f) & 1) == 0;
      bm->varr[uVar7 >> 6] = uVar1 | 1L << (uVar7 & 0x3f);
    }
    pbVar10 = (pbVar10->bb_insn_link).next;
  } while ((pbVar10 != (bb_insn_t)0x0) &&
          (pMVar4 = pbVar10->insn, *(int *)&pMVar4->field_0x18 == 0xba));
LAB_0016adec:
  peVar9 = (peVar9->out_link).next;
  goto LAB_0016acc0;
}

Assistant:

static int live_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_op_t *op_ref;
  bb_insn_t bb_insn;
  edge_t e, e2;
  int n, change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    change_p |= bitmap_ior (bb->live_out, bb->live_out, e->dst->live_in);
    if (ssa_live_info_p) {
      for (bb_insn = DLIST_HEAD (bb_insn_t, e->dst->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
        if (bb_insn->insn->code != MIR_LABEL) break;
      if (bb_insn == NULL || bb_insn->insn->code != MIR_PHI) continue; /* no phis in dst */
      for (n = 1, e2 = DLIST_HEAD (in_edge_t, e->dst->in_edges); e2 != NULL;
           e2 = DLIST_NEXT (in_edge_t, e2), n++)
        if (e2 == e) break;
      gen_assert (e2 == e);
      for (;;) {
        op_ref = &bb_insn->insn->ops[n];
        if (op_ref->mode == MIR_OP_VAR)
          change_p |= bitmap_set_bit_p (bb->live_out, var_to_scan_var (gen_ctx, op_ref->u.var));
        if ((bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) == NULL || bb_insn->insn->code != MIR_PHI)
          break;
      }
    }
  }
  return change_p;
}